

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O3

MPP_RET hal_jpegd_vdpu2_start(void *hal,HalTaskInfo *task)

{
  undefined8 uVar1;
  MppIoctlVersion MVar2;
  MPP_RET MVar3;
  ulong uVar4;
  char *fmt;
  MPP_RET MVar5;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  uVar1 = *(undefined8 *)((long)hal + 0x18);
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","hal_jpegd_vdpu2_start");
  }
  uVar4 = (task->dec).flags.val;
  MVar3 = MPP_OK;
  if ((uVar4 & 4) == 0) {
    MVar2 = mpp_get_ioctl_version();
    local_38 = 0x27c;
    if (MVar2 == IOCTL_VCODEC_SERVICE) {
      local_38 = 0x2e0;
    }
    local_34 = 0;
    local_40 = uVar1;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&local_40);
    if (MVar3 == MPP_OK) {
      local_48 = 0x27c;
      local_50 = uVar1;
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),5,&local_50);
      if (MVar3 != MPP_OK) {
        fmt = "set register read failed %d\n";
        goto LAB_0020e335;
      }
      MVar5 = MPP_OK;
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0xf,(void *)0x0);
      if (MVar3 == MPP_OK) goto joined_r0x0020e35f;
      _mpp_log_l(2,"HAL_JPEG_VDPU2","send cmd failed %d\n","hal_jpegd_vdpu2_start",
                 (ulong)(uint)MVar3);
    }
    else {
      fmt = "set register write failed %d\n";
LAB_0020e335:
      _mpp_log_l(2,"HAL_JPEG_VDPU2",fmt,"hal_jpegd_vdpu2_start",(ulong)(uint)MVar3);
    }
    uVar4 = (task->dec).flags.val;
  }
  (task->dec).flags.val = uVar4 | 4;
  MVar5 = MVar3;
joined_r0x0020e35f:
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","hal_jpegd_vdpu2_start");
  }
  return MVar5;
}

Assistant:

MPP_RET hal_jpegd_vdpu2_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;
    RK_U32 *regs = (RK_U32 *)JpegHalCtx->regs;

    jpegd_dbg_func("enter\n");
    if (task->dec.flags.parse_err)
        goto __RETURN;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = mpp_get_ioctl_version() ?
                          sizeof(((JpegdIocRegInfo *)0)->regs) :
                          sizeof(JpegdIocRegInfo) - EXTRA_INFO_SIZE;

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            goto __RETURN;
        }

        reg_size = sizeof(((JpegdIocRegInfo *)0)->regs);

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            goto __RETURN;
        }

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            goto __RETURN;
        }
    } while (0);

    jpegd_dbg_func("exit\n");
    return ret;

__RETURN:
    task->dec.flags.parse_err = 1;
    jpegd_dbg_func("exit\n");
    return ret;
}